

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleinterp.cpp
# Opt level: O1

void __thiscall BrainFuckInterpreter::interpret(BrainFuckInterpreter *this)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  invalid_argument *this_00;
  int iVar8;
  
  memset(this->tape_,0,30000);
  this->dc_ = 0;
  this->pc_ = 0;
  uVar2 = (this->p_).program._M_string_length;
  if (uVar2 != 0) {
    pcVar3 = (this->p_).program._M_dataplus._M_p;
    uVar7 = 0;
    do {
      bVar1 = pcVar3[uVar7];
      if (bVar1 < 0x3c) {
        switch(bVar1) {
        case 0x2b:
          this->tape_[this->dc_] = this->tape_[this->dc_] + '\x01';
          break;
        case 0x2c:
          uVar4 = std::istream::get();
          this->tape_[this->dc_] = uVar4;
          break;
        case 0x2d:
          this->tape_[this->dc_] = this->tape_[this->dc_] + 0xff;
          break;
        case 0x2e:
          std::ostream::put(-0x78);
          break;
        default:
switchD_0010262a_default:
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_00,"Unknown command");
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else if (bVar1 < 0x5b) {
        if (bVar1 == 0x3c) {
          uVar5 = this->dc_ - 1;
          if (this->dc_ == 0) {
            uVar5 = 29999;
          }
        }
        else {
          if (bVar1 != 0x3e) goto switchD_0010262a_default;
          uVar5 = this->dc_ + 1;
          if (uVar5 == 30000) {
            uVar5 = 0;
          }
        }
        this->dc_ = uVar5;
      }
      else if (bVar1 == 0x5b) {
        if (this->tape_[this->dc_] == '\0') {
          uVar6 = this->pc_;
          iVar8 = 1;
          do {
            uVar6 = uVar6 + 1;
            this->pc_ = uVar6;
            if (uVar2 <= uVar6) break;
            if (pcVar3[uVar6] == ']') {
              iVar8 = iVar8 + -1;
            }
            else if (pcVar3[uVar6] == '[') {
              iVar8 = iVar8 + 1;
            }
          } while (0 < iVar8);
        }
      }
      else {
        if (bVar1 != 0x5d) goto switchD_0010262a_default;
        uVar7 = (ulong)this->pc_;
        iVar8 = 1;
        do {
          if (uVar7 == 0) break;
          uVar7 = uVar7 - 1;
          this->pc_ = (uint32_t)uVar7;
          if (pcVar3[uVar7 & 0xffffffff] == ']') {
            iVar8 = iVar8 + 1;
          }
          else if (pcVar3[uVar7 & 0xffffffff] == '[') {
            iVar8 = iVar8 + -1;
          }
        } while (0 < iVar8);
        this->pc_ = this->pc_ - 1;
      }
      uVar6 = this->pc_ + 1;
      uVar7 = (ulong)uVar6;
      this->pc_ = uVar6;
    } while (uVar7 < uVar2);
  }
  return;
}

Assistant:

void interpret() {
        memset(tape_, 0, TAPE_SIZE);
        dc_ = 0;
        pc_ = 0;

        auto n = p_.program.length();
        const char* p = p_.program.data();
        int nesting {0};

        while (pc_ < n) {
            const char ch = p[pc_];
            char dch;
            switch (ch)
            {
                case '+':
                    tape_[dc_]++;
                    break;
                case '-':
                    tape_[dc_]--;
                    break;
                case '>':
                    dc_++;
                    if (dc_ == TAPE_SIZE)
                        dc_ = 0;
                    break;
                case '<':
                    dc_--;
                    if (dc_ == -1)
                        dc_ = TAPE_SIZE - 1;
                    break;
                case '.':
                    dch = tape_[dc_];
                    std::cout.put(dch);
                    break;
                case ',':
                    tape_[dc_] = std::cin.get();
                    break;
                case '[':
                    if (tape_[dc_] == 0) {
                        nesting = 1;
                        while (nesting > 0 && ++pc_ < n) {
                            if (p[pc_] == '[') {
                                nesting++;
                            } else if (p[pc_] == ']') {
                                nesting--;
                            }
                        }
                    }
                    break;
                case ']':
                    nesting = 1;
                    while (nesting > 0 && pc_ > 0) {
                        pc_--;
                        if (p[pc_] == '[') {
                            nesting--;
                        } else if (p[pc_] == ']') {
                            nesting++;
                        }
                    }
                    pc_--;
                    break;

                default:
                    throw std::invalid_argument("Unknown command");
            }
            pc_++;
        }
    }